

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_DoChannelAdaption
                  (PaAlsaStreamComponent *self,PaUtilBufferProcessor *bp,int numFrames)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  pthread_t __thread1;
  PaHostApiTypeId hostApiType;
  uint in_EDX;
  long in_RDI;
  bool bVar4;
  int __pa_unsure_error_id;
  uchar *buffer;
  int swidth;
  int convertMono;
  uchar *dst;
  uchar *src;
  int unusedChans;
  int i;
  uchar *p;
  PaError result;
  long in_stack_ffffffffffffff98;
  uchar *local_58;
  uchar *local_30;
  uint local_28;
  int local_24;
  uchar *local_20;
  
  local_28 = *(int *)(in_RDI + 0xc) - *(int *)(in_RDI + 8);
  bVar4 = false;
  if (*(int *)(in_RDI + 0xc) % 2 == 0) {
    bVar4 = *(int *)(in_RDI + 8) % 2 != 0;
  }
  if (*(int *)(in_RDI + 0x14) == 0) {
    if (bVar4) {
      iVar1 = (*alsa_snd_pcm_area_copy)
                        ((snd_pcm_channel_area_t *)
                         (*(long *)(in_RDI + 0x78) + (long)*(int *)(in_RDI + 8) * 0x10),
                         *(snd_pcm_uframes_t *)(in_RDI + 0x68),
                         (snd_pcm_channel_area_t *)
                         (*(long *)(in_RDI + 0x78) + (long)(*(int *)(in_RDI + 8) + -1) * 0x10),
                         *(snd_pcm_uframes_t *)(in_RDI + 0x68),in_EDX,
                         *(snd_pcm_format_t *)(in_RDI + 0x50));
      if (iVar1 < 0) {
        __thread1 = pthread_self();
        iVar2 = pthread_equal(__thread1,paUnixMainThread);
        if (iVar2 != 0) {
          hostApiType = iVar1 >> 0x1f;
          (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(hostApiType,in_stack_ffffffffffffff98,(char *)0x11ef2e);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_area_copy( self->channelAreas + self->numUserChannels, self->offset, self->channelAreas + ( self->numUserChannels - 1 ), self->offset, numFrames, self->nativeFormat )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3567\n"
                         );
        return -9999;
      }
      local_28 = local_28 - 1;
    }
    if (0 < (int)local_28) {
      (*alsa_snd_pcm_areas_silence)
                ((snd_pcm_channel_area_t *)
                 (*(long *)(in_RDI + 0x78) + (long)(int)(*(int *)(in_RDI + 0xc) - local_28) * 0x10),
                 *(snd_pcm_uframes_t *)(in_RDI + 0x68),local_28,(long)(int)in_EDX,
                 *(snd_pcm_format_t *)(in_RDI + 0x50));
    }
  }
  else {
    sVar3 = (*alsa_snd_pcm_format_size)(*(snd_pcm_format_t *)(in_RDI + 0x50),1);
    iVar1 = (int)sVar3;
    if (*(int *)(in_RDI + 0x18) == 0) {
      local_58 = *(uchar **)(in_RDI + 0x20);
    }
    else {
      local_58 = ExtractAddress(*(snd_pcm_channel_area_t **)(in_RDI + 0x78),
                                *(snd_pcm_uframes_t *)(in_RDI + 0x68));
    }
    local_20 = local_58 + *(int *)(in_RDI + 8) * iVar1;
    if (bVar4) {
      local_30 = local_58 + (*(int *)(in_RDI + 8) + -1) * iVar1;
      for (local_24 = 0; local_24 < (int)in_EDX; local_24 = local_24 + 1) {
        memcpy(local_30 + iVar1,local_30,(long)iVar1);
        local_30 = local_30 + *(int *)(in_RDI + 0xc) * iVar1;
      }
      local_20 = local_20 + iVar1;
      local_28 = local_28 - 1;
    }
    if (0 < (int)local_28) {
      for (local_24 = 0; local_24 < (int)in_EDX; local_24 = local_24 + 1) {
        memset(local_20,0,(long)(int)(iVar1 * local_28));
        local_20 = local_20 + *(int *)(in_RDI + 0xc) * iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static PaError PaAlsaStreamComponent_DoChannelAdaption( PaAlsaStreamComponent *self, PaUtilBufferProcessor *bp, int numFrames )
{
    PaError result = paNoError;
    unsigned char *p;
    int i;
    int unusedChans = self->numHostChannels - self->numUserChannels;
    unsigned char *src, *dst;
    int convertMono = ( self->numHostChannels % 2 ) == 0 && ( self->numUserChannels % 2 ) != 0;

    assert( StreamDirection_Out == self->streamDir );

    if( self->hostInterleaved )
    {
        int swidth = alsa_snd_pcm_format_size( self->nativeFormat, 1 );
        unsigned char *buffer = self->canMmap ? ExtractAddress( self->channelAreas, self->offset ) : self->nonMmapBuffer;

        /* Start after the last user channel */
        p = buffer + self->numUserChannels * swidth;

        if( convertMono )
        {
            /* Convert the last user channel into stereo pair */
            src = buffer + ( self->numUserChannels - 1 ) * swidth;
            for( i = 0; i < numFrames; ++i )
            {
                dst = src + swidth;
                memcpy( dst, src, swidth );
                src += self->numHostChannels * swidth;
            }

            /* Don't touch the channel we just wrote to */
            p += swidth;
            --unusedChans;
        }

        if( unusedChans > 0 )
        {
            /* Silence unused output channels */
            for( i = 0; i < numFrames; ++i )
            {
                memset( p, 0, swidth * unusedChans );
                p += self->numHostChannels * swidth;
            }
        }
    }
    else
    {
        /* We extract the last user channel */
        if( convertMono )
        {
            ENSURE_( alsa_snd_pcm_area_copy( self->channelAreas + self->numUserChannels, self->offset, self->channelAreas +
                    ( self->numUserChannels - 1 ), self->offset, numFrames, self->nativeFormat ), paUnanticipatedHostError );
            --unusedChans;
        }
        if( unusedChans > 0 )
        {
            alsa_snd_pcm_areas_silence( self->channelAreas + ( self->numHostChannels - unusedChans ), self->offset, unusedChans, numFrames,
                    self->nativeFormat );
        }
    }

error:
    return result;
}